

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmisc.c
# Opt level: O0

int quorem_D2A(Bigint *b,Bigint *S)

{
  int iVar1;
  ULong *pUVar2;
  ulong uVar3;
  ULong *pUVar4;
  bool bVar5;
  unsigned_long_long ys;
  unsigned_long_long y;
  unsigned_long_long carry;
  unsigned_long_long borrow;
  ULong *sxe;
  ULong *sx;
  ULong *pUStack_38;
  ULong q;
  ULong *bxe;
  ULong *bx;
  int n;
  Bigint *S_local;
  Bigint *b_local;
  
  if (b->wds < S->wds) {
    b_local._4_4_ = 0;
  }
  else {
    bx._4_4_ = S->wds + -1;
    pUVar2 = S->x + bx._4_4_;
    pUStack_38 = b->x + bx._4_4_;
    sx._4_4_ = *pUStack_38 / (*pUVar2 + 1);
    if (sx._4_4_ != 0) {
      carry = 0;
      y = 0;
      sxe = S->x;
      bxe = b->x;
      do {
        pUVar4 = sxe + 1;
        uVar3 = (ulong)*sxe * (ulong)sx._4_4_ + y;
        y = uVar3 >> 0x20;
        uVar3 = ((ulong)*bxe - (uVar3 & 0xffffffff)) - carry;
        carry = uVar3 >> 0x20 & 1;
        *bxe = (ULong)uVar3;
        sxe = pUVar4;
        bxe = bxe + 1;
      } while (pUVar4 <= pUVar2);
      if (*pUStack_38 == 0) {
        while( true ) {
          pUStack_38 = pUStack_38 + -1;
          bVar5 = false;
          if (b->x < pUStack_38) {
            bVar5 = *pUStack_38 == 0;
          }
          if (!bVar5) break;
          bx._4_4_ = bx._4_4_ + -1;
        }
        b->wds = bx._4_4_;
      }
    }
    iVar1 = cmp_D2A(b,S);
    if (-1 < iVar1) {
      sx._4_4_ = sx._4_4_ + 1;
      carry = 0;
      y = 0;
      sxe = S->x;
      bxe = b->x;
      do {
        pUVar4 = sxe + 1;
        uVar3 = *sxe + y;
        y = uVar3 >> 0x20;
        uVar3 = ((ulong)*bxe - (uVar3 & 0xffffffff)) - carry;
        carry = uVar3 >> 0x20 & 1;
        *bxe = (ULong)uVar3;
        sxe = pUVar4;
        bxe = bxe + 1;
      } while (pUVar4 <= pUVar2);
      pUStack_38 = b->x + bx._4_4_;
      if (*pUStack_38 == 0) {
        while( true ) {
          pUStack_38 = pUStack_38 + -1;
          bVar5 = false;
          if (b->x < pUStack_38) {
            bVar5 = *pUStack_38 == 0;
          }
          if (!bVar5) break;
          bx._4_4_ = bx._4_4_ + -1;
        }
        b->wds = bx._4_4_;
      }
    }
    b_local._4_4_ = sx._4_4_;
  }
  return b_local._4_4_;
}

Assistant:

int
quorem
#ifdef KR_headers
	(b, S) Bigint *b, *S;
#else
	(Bigint *b, Bigint *S)
#endif
{
	int n;
	ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
	ULLong borrow, carry, y, ys;
#else
	ULong borrow, carry, y, ys;
#ifdef Pack_32
	ULong si, z, zs;
#endif
#endif

	n = S->wds;
#ifdef DEBUG
	/*debug*/ if (b->wds > n)
	/*debug*/	Bug("oversize b in quorem");
#endif
	if (b->wds < n)
		return 0;
	sx = S->x;
	sxe = sx + --n;
	bx = b->x;
	bxe = bx + n;
	q = *bxe / (*sxe + 1);	/* ensure q <= true quotient */
#ifdef DEBUG
	/*debug*/ if (q > 9)
	/*debug*/	Bug("oversized quotient in quorem");
#endif
	if (q) {
		borrow = 0;
		carry = 0;
		do {
#ifdef ULLong
			ys = *sx++ * (ULLong)q + carry;
			carry = ys >> 32;
			y = *bx - (ys & 0xffffffffUL) - borrow;
			borrow = y >> 32 & 1UL;
			*bx++ = (ULong)(y & 0xffffffffUL);
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) * q + carry;
			zs = (si >> 16) * q + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ * q + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		if (!*bxe) {
			bx = b->x;
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	if (cmp(b, S) >= 0) {
		q++;
		borrow = 0;
		carry = 0;
		bx = b->x;
		sx = S->x;
		do {
#ifdef ULLong
			ys = *sx++ + carry;
			carry = ys >> 32;
			y = *bx - (ys & 0xffffffffUL) - borrow;
			borrow = y >> 32 & 1UL;
			*bx++ = (ULong)(y & 0xffffffffUL);
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) + carry;
			zs = (si >> 16) + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		bx = b->x;
		bxe = bx + n;
		if (!*bxe) {
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	return q;
	}